

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O1

void __thiscall
ServerSocketUDP::ServerSocketUDP(ServerSocketUDP *this,int domain,int type,int protocol,int port)

{
  this->portNumber = port;
  this->serverSocketFD = -1;
  socketServer(this,domain,type,protocol);
  bindServer(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Binding successfully done....",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

ServerSocketUDP::ServerSocketUDP(int domain, int type, int protocol, int port) {
    this->portNumber = port;
    this->serverSocketFD = -1;  //FD: file descriptor 文件描述符
    this->socketServer(domain, type, protocol);
    if (this->bindServer() > 0) {
        cout << "Binding successfully done...." << endl;
    }
}